

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeat.cpp
# Opt level: O2

void duckdb::RepeatListFunction(DataChunk *args,ExpressionState *param_2,Vector *result)

{
  value_type vVar1;
  value_type vVar2;
  list_entry_t *plVar3;
  long lVar4;
  long *plVar5;
  anon_class_32_4_1eb07289 fun;
  anon_class_32_4_1eb07289 fun_00;
  anon_class_32_4_1eb07289 fun_01;
  anon_class_32_4_1eb07289 fun_02;
  anon_class_32_4_1eb07289 fun_03;
  anon_class_32_4_1eb07289 fun_04;
  anon_class_32_4_1eb07289 fun_05;
  anon_class_32_4_1eb07289 fun_06;
  anon_class_32_4_1eb07289 fun_07;
  anon_class_32_4_1eb07289 fun_08;
  anon_class_32_4_1eb07289 fun_09;
  anon_class_32_4_1eb07289 fun_10;
  reference vector;
  reference vector_00;
  undefined8 uVar6;
  Vector *pVVar7;
  UnifiedVectorFormat *pUVar8;
  UnifiedVectorFormat *pUVar9;
  UnifiedVectorFormat *pUVar10;
  ValidityMask *pVVar11;
  ValidityMask *pVVar12;
  ValidityMask *pVVar13;
  ulong uVar15;
  ulong uVar16;
  uint64_t *puVar17;
  VectorType VVar18;
  idx_t in_R8;
  UnifiedVectorFormat *pUVar19;
  UnifiedVectorFormat *pUVar20;
  ulong uVar21;
  ulong uVar22;
  long lVar23;
  long lVar24;
  bool bVar25;
  list_entry_t lVar26;
  list_entry_t left;
  list_entry_t left_00;
  list_entry_t left_01;
  list_entry_t left_02;
  list_entry_t left_03;
  list_entry_t left_04;
  list_entry_t left_05;
  idx_t current_size;
  long *local_c0;
  long local_b8;
  long local_b0;
  UnifiedVectorFormat ldata;
  long local_70;
  long local_68;
  undefined7 uVar14;
  
  vector = vector<duckdb::Vector,_true>::get<true>((vector<duckdb::Vector,_true> *)args,0);
  vector_00 = vector<duckdb::Vector,_true>::get<true>((vector<duckdb::Vector,_true> *)args,1);
  uVar6 = duckdb::ListVector::GetEntry(vector);
  pVVar7 = (Vector *)duckdb::ListVector::GetEntry(result);
  current_size = duckdb::ListVector::GetListSize(result);
  pUVar20 = *(UnifiedVectorFormat **)(args + 0x18);
  vVar1 = *vector;
  vVar2 = *vector_00;
  uVar14 = (undefined7)((ulong)&current_size >> 8);
  pVVar11 = (ValidityMask *)CONCAT71(uVar14,vVar2);
  VVar18 = (VectorType)result;
  if (((byte)vVar1 ^ 2) == 0 && ((byte)vVar2 ^ 2) == 0) {
    duckdb::Vector::SetVectorType(VVar18);
    plVar3 = *(list_entry_t **)(result + 0x20);
    if (((*(byte **)(vector + 0x28) == (byte *)0x0) || ((**(byte **)(vector + 0x28) & 1) != 0)) &&
       ((*(byte **)(vector_00 + 0x28) == (byte *)0x0 || ((**(byte **)(vector_00 + 0x28) & 1) != 0)))
       ) {
      fun_01.result = result;
      fun_01.current_size = &current_size;
      fun_01.source_child = (Vector *)uVar6;
      fun_01.result_child = pVVar7;
      lVar26 = BinaryLambdaWrapper::
               Operation<duckdb::RepeatListFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::list_entry_t,long,duckdb::list_entry_t>
                         (fun_01,**(list_entry_t **)(vector + 0x20),
                          (long)((*(ValidityMask **)(vector_00 + 0x20))->
                                super_TemplatedValidityMask<unsigned_long>).validity_mask,
                          *(ValidityMask **)(vector_00 + 0x20),in_R8);
      *plVar3 = lVar26;
      goto LAB_007a8b43;
    }
  }
  else {
    if (((byte)vVar2 ^ 2) == 0 && vVar1 == (value_type)0x0) {
      lVar4 = *(long *)(vector + 0x20);
      plVar5 = *(long **)(vector_00 + 0x20);
      if ((*(byte **)(vector_00 + 0x28) == (byte *)0x0) ||
         ((**(byte **)(vector_00 + 0x28) & 1) != 0)) {
        duckdb::Vector::SetVectorType(VVar18);
        lVar23 = *(long *)(result + 0x20);
        FlatVector::VerifyFlatVector(result);
        FlatVector::VerifyFlatVector(vector);
        FlatVector::SetValidity(result,(ValidityMask *)(vector + 0x28));
        if (*(long *)(result + 0x28) == 0) {
          lVar24 = 8;
          while (bVar25 = pUVar20 != (UnifiedVectorFormat *)0x0, pUVar20 = pUVar20 + -1, bVar25) {
            fun_05.result = result;
            fun_05.current_size = &current_size;
            fun_05.source_child = (Vector *)uVar6;
            fun_05.result_child = pVVar7;
            left_02.length = *(uint64_t *)(lVar4 + lVar24);
            left_02.offset = *(uint64_t *)(lVar4 + -8 + lVar24);
            lVar26 = BinaryLambdaWrapper::
                     Operation<duckdb::RepeatListFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::list_entry_t,long,duckdb::list_entry_t>
                               (fun_05,left_02,*plVar5,pVVar11,in_R8);
            *(uint64_t *)(lVar23 + -8 + lVar24) = lVar26.offset;
            *(uint64_t *)(lVar23 + lVar24) = lVar26.length;
            lVar24 = lVar24 + 0x10;
          }
        }
        else {
          pUVar19 = (UnifiedVectorFormat *)0x0;
          for (uVar15 = 0; uVar15 != (ulong)(pUVar20 + 0x3f) >> 6; uVar15 = uVar15 + 1) {
            if (*(long *)(result + 0x28) == 0) {
              pUVar9 = pUVar19 + 0x40;
              if (pUVar20 <= pUVar19 + 0x40) {
                pUVar9 = pUVar20;
              }
LAB_007a8488:
              uVar21 = (long)pUVar19 << 4 | 8;
              pUVar10 = pUVar20;
              for (; pUVar8 = pUVar19, pUVar19 < pUVar9; pUVar19 = pUVar19 + 1) {
                fun.result = result;
                fun.current_size = &current_size;
                fun.source_child = (Vector *)uVar6;
                fun.result_child = pVVar7;
                left.length = *(uint64_t *)(lVar4 + uVar21);
                left.offset = *(uint64_t *)(lVar4 + -8 + uVar21);
                lVar26 = BinaryLambdaWrapper::
                         Operation<duckdb::RepeatListFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::list_entry_t,long,duckdb::list_entry_t>
                                   (fun,left,*plVar5,(ValidityMask *)pUVar10,in_R8);
                *(uint64_t *)(lVar23 + -8 + uVar21) = lVar26.offset;
                *(uint64_t *)(lVar23 + uVar21) = lVar26.length;
                uVar21 = uVar21 + 0x10;
              }
            }
            else {
              uVar21 = *(ulong *)(*(long *)(result + 0x28) + uVar15 * 8);
              pUVar9 = pUVar19 + 0x40;
              if (pUVar20 <= pUVar19 + 0x40) {
                pUVar9 = pUVar20;
              }
              if (uVar21 == 0xffffffffffffffff) goto LAB_007a8488;
              pUVar8 = pUVar9;
              if (uVar21 != 0) {
                uVar16 = (long)pUVar19 << 4 | 8;
                pUVar10 = pUVar20;
                for (uVar22 = 0; pUVar8 = pUVar19 + uVar22, pUVar19 + uVar22 < pUVar9;
                    uVar22 = uVar22 + 1) {
                  if ((uVar21 >> (uVar22 & 0x3f) & 1) != 0) {
                    fun_00.result = result;
                    fun_00.current_size = &current_size;
                    fun_00.source_child = (Vector *)uVar6;
                    fun_00.result_child = pVVar7;
                    left_00.length = *(uint64_t *)(lVar4 + uVar16);
                    left_00.offset = *(uint64_t *)(lVar4 + -8 + uVar16);
                    lVar26 = BinaryLambdaWrapper::
                             Operation<duckdb::RepeatListFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::list_entry_t,long,duckdb::list_entry_t>
                                       (fun_00,left_00,*plVar5,(ValidityMask *)pUVar10,in_R8);
                    *(uint64_t *)(lVar23 + -8 + uVar16) = lVar26.offset;
                    *(uint64_t *)(lVar23 + uVar16) = lVar26.length;
                  }
                  uVar16 = uVar16 + 0x10;
                }
              }
            }
            pUVar19 = pUVar8;
          }
        }
        goto LAB_007a8b43;
      }
    }
    else {
      if (((byte)vVar1 ^ 2) != 0 || vVar2 != (value_type)0x0) {
        pVVar11 = (ValidityMask *)CONCAT71(uVar14,(byte)vVar2 | (byte)vVar1);
        if (((byte)vVar2 | (byte)vVar1) == 0) {
          lVar4 = *(long *)(vector + 0x20);
          lVar23 = *(long *)(vector_00 + 0x20);
          duckdb::Vector::SetVectorType(VVar18);
          pVVar12 = *(ValidityMask **)(result + 0x20);
          FlatVector::VerifyFlatVector(result);
          FlatVector::VerifyFlatVector(vector);
          FlatVector::SetValidity(result,(ValidityMask *)(vector + 0x28));
          FlatVector::VerifyFlatVector(vector_00);
          duckdb::ValidityMask::Combine((ValidityMask *)(result + 0x28),(ulong)(vector_00 + 0x28));
          if (*(long *)(result + 0x28) == 0) {
            lVar24 = 0;
            while (bVar25 = pUVar20 != (UnifiedVectorFormat *)0x0, pUVar20 = pUVar20 + -1, bVar25) {
              fun_10.result = result;
              fun_10.current_size = &current_size;
              fun_10.source_child = (Vector *)uVar6;
              fun_10.result_child = pVVar7;
              lVar26.length = *(uint64_t *)(lVar4 + 8 + lVar24 * 2);
              lVar26.offset = *(uint64_t *)(lVar4 + lVar24 * 2);
              lVar26 = BinaryLambdaWrapper::
                       Operation<duckdb::RepeatListFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::list_entry_t,long,duckdb::list_entry_t>
                                 (fun_10,lVar26,*(long *)(lVar23 + lVar24),pVVar11,in_R8);
              *(uint64_t *)
               ((long)&(pVVar12->super_TemplatedValidityMask<unsigned_long>).validity_mask +
               lVar24 * 2) = lVar26.offset;
              *(uint64_t *)
               ((long)&(pVVar12->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
                       super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr + lVar24 * 2) = lVar26.length;
              lVar24 = lVar24 + 8;
            }
          }
          else {
            pUVar19 = (UnifiedVectorFormat *)0x0;
            for (pVVar11 = (ValidityMask *)0x0;
                pVVar11 != (ValidityMask *)((ulong)(pUVar20 + 0x3f) >> 6);
                pVVar11 = (ValidityMask *)
                          ((long)&(pVVar11->super_TemplatedValidityMask<unsigned_long>).
                                  validity_mask + 1)) {
              lVar24 = *(long *)(result + 0x28);
              if (lVar24 == 0) {
                pUVar9 = pUVar19 + 0x40;
                if (pUVar20 <= pUVar19 + 0x40) {
                  pUVar9 = pUVar20;
                }
LAB_007a897c:
                uVar15 = (long)pUVar19 << 4 | 8;
                pVVar13 = pVVar11;
                for (; pUVar10 = pUVar19, pUVar19 < pUVar9; pUVar19 = pUVar19 + 1) {
                  fun_06.result = result;
                  fun_06.current_size = &current_size;
                  fun_06.source_child = (Vector *)uVar6;
                  fun_06.result_child = pVVar7;
                  left_03.length = *(uint64_t *)(lVar4 + uVar15);
                  left_03.offset = *(uint64_t *)(lVar4 + -8 + uVar15);
                  lVar26 = BinaryLambdaWrapper::
                           Operation<duckdb::RepeatListFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::list_entry_t,long,duckdb::list_entry_t>
                                     (fun_06,left_03,*(long *)(lVar23 + (long)pUVar19 * 8),pVVar13,
                                      in_R8);
                  *(uint64_t *)((long)pVVar12 + (uVar15 - 8)) = lVar26.offset;
                  *(uint64_t *)
                   ((long)&(pVVar12->super_TemplatedValidityMask<unsigned_long>).validity_mask +
                   uVar15) = lVar26.length;
                  uVar15 = uVar15 + 0x10;
                }
              }
              else {
                uVar15 = *(ulong *)(lVar24 + (long)pVVar11 * 8);
                pUVar9 = pUVar19 + 0x40;
                if (pUVar20 <= pUVar19 + 0x40) {
                  pUVar9 = pUVar20;
                }
                if (uVar15 == 0xffffffffffffffff) goto LAB_007a897c;
                pUVar10 = pUVar9;
                if (uVar15 != 0) {
                  uVar16 = (long)pUVar19 << 4 | 8;
                  pVVar13 = pVVar11;
                  for (uVar21 = 0; pUVar10 = pUVar19 + uVar21, pUVar19 + uVar21 < pUVar9;
                      uVar21 = uVar21 + 1) {
                    if ((uVar15 >> (uVar21 & 0x3f) & 1) != 0) {
                      fun_07.result = result;
                      fun_07.current_size = &current_size;
                      fun_07.source_child = (Vector *)uVar6;
                      fun_07.result_child = pVVar7;
                      left_04.length = *(uint64_t *)(lVar4 + uVar16);
                      left_04.offset = *(uint64_t *)(lVar4 + -8 + uVar16);
                      lVar26 = BinaryLambdaWrapper::
                               Operation<duckdb::RepeatListFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::list_entry_t,long,duckdb::list_entry_t>
                                         (fun_07,left_04,
                                          *(long *)(lVar23 + (long)pUVar19 * 8 + uVar21 * 8),pVVar13
                                          ,in_R8);
                      *(uint64_t *)((long)pVVar12 + (uVar16 - 8)) = lVar26.offset;
                      *(uint64_t *)
                       ((long)&(pVVar12->super_TemplatedValidityMask<unsigned_long>).validity_mask +
                       uVar16) = lVar26.length;
                      pVVar13 = pVVar12;
                    }
                    uVar16 = uVar16 + 0x10;
                  }
                }
              }
              pUVar19 = pUVar10;
            }
          }
        }
        else {
          duckdb::UnifiedVectorFormat::UnifiedVectorFormat(&ldata);
          duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&local_c0);
          duckdb::Vector::ToUnifiedFormat((ulong)vector,pUVar20);
          duckdb::Vector::ToUnifiedFormat((ulong)vector_00,pUVar20);
          duckdb::Vector::SetVectorType(VVar18);
          lVar4 = *(long *)(result + 0x20);
          FlatVector::VerifyFlatVector(result);
          if (local_b0 == 0 && local_68 == 0) {
            puVar17 = (uint64_t *)(lVar4 + 8);
            for (pUVar19 = (UnifiedVectorFormat *)0x0; pUVar20 != pUVar19; pUVar19 = pUVar19 + 1) {
              pUVar9 = pUVar19;
              if (*_ldata != 0) {
                pUVar9 = (UnifiedVectorFormat *)(ulong)*(uint *)(*_ldata + (long)pUVar19 * 4);
              }
              pUVar10 = pUVar19;
              if (*local_c0 != 0) {
                pUVar10 = (UnifiedVectorFormat *)(ulong)*(uint *)(*local_c0 + (long)pUVar19 * 4);
              }
              fun_02.result = result;
              fun_02.current_size = &current_size;
              fun_02.source_child = (Vector *)uVar6;
              fun_02.result_child = pVVar7;
              left_01.length = *(uint64_t *)(local_70 + 8 + (long)pUVar9 * 0x10);
              left_01.offset = *(uint64_t *)(local_70 + (long)pUVar9 * 0x10);
              lVar26 = BinaryLambdaWrapper::
                       Operation<duckdb::RepeatListFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::list_entry_t,long,duckdb::list_entry_t>
                                 (fun_02,left_01,*(long *)(local_b8 + (long)pUVar10 * 8),
                                  (ValidityMask *)pUVar10,in_R8);
              puVar17[-1] = lVar26.offset;
              *puVar17 = lVar26.length;
              puVar17 = puVar17 + 2;
            }
          }
          else {
            puVar17 = (uint64_t *)(lVar4 + 8);
            for (pUVar19 = (UnifiedVectorFormat *)0x0; pUVar20 != pUVar19; pUVar19 = pUVar19 + 1) {
              pUVar9 = pUVar19;
              if (*_ldata != 0) {
                pUVar9 = (UnifiedVectorFormat *)(ulong)*(uint *)(*_ldata + (long)pUVar19 * 4);
              }
              pUVar10 = pUVar19;
              if (*local_c0 != 0) {
                pUVar10 = (UnifiedVectorFormat *)(ulong)*(uint *)(*local_c0 + (long)pUVar19 * 4);
              }
              if (((local_68 == 0) ||
                  ((*(ulong *)(local_68 + ((ulong)pUVar9 >> 6) * 8) >> ((ulong)pUVar9 & 0x3f) & 1)
                   != 0)) &&
                 ((local_b0 == 0 ||
                  ((*(ulong *)(local_b0 + ((ulong)pUVar10 >> 6) * 8) >> ((ulong)pUVar10 & 0x3f) & 1)
                   != 0)))) {
                fun_08.result = result;
                fun_08.current_size = &current_size;
                fun_08.source_child = (Vector *)uVar6;
                fun_08.result_child = pVVar7;
                left_05.length = *(uint64_t *)(local_70 + 8 + (long)pUVar9 * 0x10);
                left_05.offset = *(uint64_t *)(local_70 + (long)pUVar9 * 0x10);
                lVar26 = BinaryLambdaWrapper::
                         Operation<duckdb::RepeatListFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::list_entry_t,long,duckdb::list_entry_t>
                                   (fun_08,left_05,*(long *)(local_b8 + (long)pUVar10 * 8),
                                    (ValidityMask *)pUVar10,in_R8);
                puVar17[-1] = lVar26.offset;
                *puVar17 = lVar26.length;
              }
              else {
                TemplatedValidityMask<unsigned_long>::SetInvalid
                          ((TemplatedValidityMask<unsigned_long> *)(result + 0x28),(idx_t)pUVar19);
              }
              puVar17 = puVar17 + 2;
            }
          }
          UnifiedVectorFormat::~UnifiedVectorFormat((UnifiedVectorFormat *)&local_c0);
          UnifiedVectorFormat::~UnifiedVectorFormat(&ldata);
        }
        goto LAB_007a8b43;
      }
      plVar3 = *(list_entry_t **)(vector + 0x20);
      lVar4 = *(long *)(vector_00 + 0x20);
      if ((*(byte **)(vector + 0x28) == (byte *)0x0) || ((**(byte **)(vector + 0x28) & 1) != 0)) {
        duckdb::Vector::SetVectorType(VVar18);
        lVar23 = *(long *)(result + 0x20);
        FlatVector::VerifyFlatVector(result);
        FlatVector::VerifyFlatVector(vector_00);
        FlatVector::SetValidity(result,(ValidityMask *)(vector_00 + 0x28));
        if (*(long *)(result + 0x28) == 0) {
          puVar17 = (uint64_t *)(lVar23 + 8);
          for (pUVar19 = (UnifiedVectorFormat *)0x0; pUVar20 != pUVar19; pUVar19 = pUVar19 + 1) {
            fun_09.result = result;
            fun_09.current_size = &current_size;
            fun_09.source_child = (Vector *)uVar6;
            fun_09.result_child = pVVar7;
            lVar26 = BinaryLambdaWrapper::
                     Operation<duckdb::RepeatListFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::list_entry_t,long,duckdb::list_entry_t>
                               (fun_09,*plVar3,*(long *)(lVar4 + (long)pUVar19 * 8),pVVar11,in_R8);
            puVar17[-1] = lVar26.offset;
            *puVar17 = lVar26.length;
            puVar17 = puVar17 + 2;
          }
        }
        else {
          lVar23 = lVar23 + 8;
          pUVar19 = (UnifiedVectorFormat *)0x0;
          for (pVVar11 = (ValidityMask *)0x0;
              pVVar11 != (ValidityMask *)((ulong)(pUVar20 + 0x3f) >> 6);
              pVVar11 = (ValidityMask *)
                        ((long)&(pVVar11->super_TemplatedValidityMask<unsigned_long>).validity_mask
                        + 1)) {
            if (*(long *)(result + 0x28) == 0) {
              pUVar9 = pUVar19 + 0x40;
              if (pUVar20 <= pUVar19 + 0x40) {
                pUVar9 = pUVar20;
              }
LAB_007a877f:
              puVar17 = (uint64_t *)((long)pUVar19 * 0x10 + lVar23);
              pVVar12 = pVVar11;
              for (; pUVar10 = pUVar19, pUVar19 < pUVar9; pUVar19 = pUVar19 + 1) {
                fun_03.result = result;
                fun_03.current_size = &current_size;
                fun_03.source_child = (Vector *)uVar6;
                fun_03.result_child = pVVar7;
                lVar26 = BinaryLambdaWrapper::
                         Operation<duckdb::RepeatListFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::list_entry_t,long,duckdb::list_entry_t>
                                   (fun_03,*plVar3,*(long *)(lVar4 + (long)pUVar19 * 8),pVVar12,
                                    in_R8);
                puVar17[-1] = lVar26.offset;
                *puVar17 = lVar26.length;
                puVar17 = puVar17 + 2;
              }
            }
            else {
              uVar15 = *(ulong *)(*(long *)(result + 0x28) + (long)pVVar11 * 8);
              pUVar9 = pUVar19 + 0x40;
              if (pUVar20 <= pUVar19 + 0x40) {
                pUVar9 = pUVar20;
              }
              if (uVar15 == 0xffffffffffffffff) goto LAB_007a877f;
              pUVar10 = pUVar9;
              if (uVar15 != 0) {
                puVar17 = (uint64_t *)((long)pUVar19 * 0x10 + lVar23);
                pVVar12 = pVVar11;
                for (uVar21 = 0; pUVar10 = pUVar19 + uVar21, pUVar19 + uVar21 < pUVar9;
                    uVar21 = uVar21 + 1) {
                  if ((uVar15 >> (uVar21 & 0x3f) & 1) != 0) {
                    fun_04.result = result;
                    fun_04.current_size = &current_size;
                    fun_04.source_child = (Vector *)uVar6;
                    fun_04.result_child = pVVar7;
                    lVar26 = BinaryLambdaWrapper::
                             Operation<duckdb::RepeatListFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::list_entry_t,long,duckdb::list_entry_t>
                                       (fun_04,*plVar3,
                                        *(long *)(lVar4 + (long)pUVar19 * 8 + uVar21 * 8),pVVar12,
                                        in_R8);
                    puVar17[-1] = lVar26.offset;
                    *puVar17 = lVar26.length;
                  }
                  puVar17 = puVar17 + 2;
                }
              }
            }
            pUVar19 = pUVar10;
          }
        }
        goto LAB_007a8b43;
      }
    }
    duckdb::Vector::SetVectorType(VVar18);
  }
  duckdb::ConstantVector::SetNull(result,true);
LAB_007a8b43:
  duckdb::ListVector::SetListSize(result,current_size);
  return;
}

Assistant:

static void RepeatListFunction(DataChunk &args, ExpressionState &, Vector &result) {
	auto &list_vector = args.data[0];
	auto &cnt_vector = args.data[1];

	auto &source_child = ListVector::GetEntry(list_vector);
	auto &result_child = ListVector::GetEntry(result);

	idx_t current_size = ListVector::GetListSize(result);
	BinaryExecutor::Execute<list_entry_t, int64_t, list_entry_t>(
	    list_vector, cnt_vector, result, args.size(), [&](list_entry_t list_input, int64_t cnt) {
		    idx_t copy_count = cnt <= 0 || list_input.length == 0 ? 0 : UnsafeNumericCast<idx_t>(cnt);
		    idx_t result_length = list_input.length * copy_count;
		    idx_t new_size = current_size + result_length;
		    ListVector::Reserve(result, new_size);
		    list_entry_t result_list;
		    result_list.offset = current_size;
		    result_list.length = result_length;
		    for (idx_t i = 0; i < copy_count; i++) {
			    // repeat the list contents "cnt" times
			    VectorOperations::Copy(source_child, result_child, list_input.offset + list_input.length,
			                           list_input.offset, current_size);
			    current_size += list_input.length;
		    }
		    return result_list;
	    });
	ListVector::SetListSize(result, current_size);
}